

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedEventLoop.cpp
# Opt level: O2

void __thiscall Storage::TimedEventLoop::run_for(TimedEventLoop *this,Cycles cycles)

{
  long lVar1;
  uint __line;
  char *__assertion;
  WrappedInt<Cycles> WVar2;
  WrappedInt<Cycles> WVar3;
  
  WVar2.length_ = 0;
  WVar3 = cycles.super_WrappedInt<Cycles>.length_;
  while( true ) {
    lVar1 = this->cycles_until_event_;
    if (lVar1 - WVar3.length_ != 0 && WVar3.length_ <= lVar1) break;
    WVar2.length_ = WVar2.length_ + lVar1;
    (*this->_vptr_TimedEventLoop[1])(this);
    WVar3.length_ = WVar3.length_ - this->cycles_until_event_;
    this->cycles_until_event_ = 0;
    (**this->_vptr_TimedEventLoop)(this);
  }
  if (WVar3.length_ != 0) {
    this->cycles_until_event_ = lVar1 - WVar3.length_;
    WVar2.length_ = WVar2.length_ + WVar3.length_;
    (*this->_vptr_TimedEventLoop[1])(this,WVar3.length_);
  }
  if ((WrappedInt<Cycles>)WVar2.length_ == cycles.super_WrappedInt<Cycles>.length_) {
    if (0 < this->cycles_until_event_) {
      return;
    }
    __assertion = "cycles_until_event_ > 0";
    __line = 0x2d;
  }
  else {
    __assertion = "cycles_advanced == cycles.as_integral()";
    __line = 0x2c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/TimedEventLoop.cpp"
                ,__line,"void Storage::TimedEventLoop::run_for(const Cycles)");
}

Assistant:

void TimedEventLoop::run_for(const Cycles cycles) {
	auto remaining_cycles = cycles.as_integral();
#ifndef NDEBUG
	decltype(remaining_cycles) cycles_advanced = 0;
#endif

	while(cycles_until_event_ <= remaining_cycles) {
#ifndef NDEBUG
		cycles_advanced += cycles_until_event_;
#endif
		advance(cycles_until_event_);
		remaining_cycles -= cycles_until_event_;
		cycles_until_event_ = 0;
		process_next_event();
	}

	if(remaining_cycles) {
		cycles_until_event_ -= remaining_cycles;
#ifndef NDEBUG
		cycles_advanced += remaining_cycles;
#endif
		advance(remaining_cycles);
	}

	assert(cycles_advanced == cycles.as_integral());
	assert(cycles_until_event_ > 0);
}